

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void __thiscall
cmsys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  char *pcVar1;
  int iVar2;
  char *local_28;
  char *dum;
  int ind;
  RegularExpression *rxp_local;
  RegularExpression *this_local;
  
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    this->progsize = rxp->progsize;
    pcVar1 = (char *)operator_new__((long)this->progsize);
    this->program = pcVar1;
    dum._4_4_ = this->progsize;
    while (iVar2 = dum._4_4_ + -1, dum._4_4_ != 0) {
      this->program[iVar2] = rxp->program[iVar2];
      dum._4_4_ = iVar2;
    }
    this->startp[0] = rxp->startp[0];
    this->endp[0] = rxp->endp[0];
    this->regmust = rxp->regmust;
    if (rxp->regmust != (char *)0x0) {
      local_28 = rxp->program;
      dum._4_4_ = 0;
      for (; local_28 != rxp->regmust; local_28 = local_28 + 1) {
        dum._4_4_ = dum._4_4_ + 1;
      }
      this->regmust = this->program + dum._4_4_;
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression (const RegularExpression& rxp) {
  if ( !rxp.program )
    {
    this->program = 0;
    return;
    }
  int ind;
  this->progsize = rxp.progsize;                // Copy regular expression size
  this->program = new char[this->progsize];     // Allocate storage
  for(ind=this->progsize; ind-- != 0;)          // Copy regular expresion
    this->program[ind] = rxp.program[ind];
  this->startp[0] = rxp.startp[0];              // Copy pointers into last
  this->endp[0] = rxp.endp[0];                  // Successful "find" operation
  this->regmust = rxp.regmust;                  // Copy field
  if (rxp.regmust != 0) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart;                // Copy starting index
  this->reganch = rxp.reganch;                  // Copy remaining private data
  this->regmlen = rxp.regmlen;                  // Copy remaining private data
}